

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateIndices(ValidationContext *this)

{
  bool bVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  unsigned_long *in_stack_00000008;
  IssueError *in_stack_00000010;
  ValidationContext *in_stack_00000018;
  IssueError *in_stack_00000020;
  ValidationContext *in_stack_00000028;
  ktxSupercmpScheme in_stack_00000034;
  size_t expectedOffset;
  unsigned_long levelIndexSize;
  ktxSupercmpScheme supercompressionScheme;
  unsigned_long in_stack_ffffffffffffff68;
  unsigned_long in_stack_ffffffffffffff70;
  string local_78 [48];
  string local_48 [36];
  int local_24;
  unsigned_long local_20;
  long local_18;
  ktxSupercmpScheme local_c;
  
  local_c = *(ktxSupercmpScheme *)(in_RDI + 100);
  if ((*(int *)(in_RDI + 0x68) == 0) || (*(int *)(in_RDI + 0x6c) == 0)) {
    error<unsigned_int&,unsigned_int&>
              (in_stack_00000018,in_stack_00000010,(uint *)in_stack_00000008,(uint *)unaff_retaddr);
  }
  local_18 = (ulong)*(uint *)(in_RDI + 0x8c) * 0x18;
  local_20 = local_18 + 0x50;
  local_20 = align<unsigned_long>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (local_20 != *(uint *)(in_RDI + 0x68)) {
    error<unsigned_int&,unsigned_long&>
              (in_stack_00000018,in_stack_00000010,(uint *)in_stack_00000008,
               (unsigned_long *)unaff_retaddr);
  }
  local_20 = *(uint *)(in_RDI + 0x6c) + local_20;
  if ((((*(int *)(in_RDI + 0x68) != 0) && (*(int *)(in_RDI + 0x6c) != 0)) &&
      (*(int *)(in_RDI + 0x70) != 0)) &&
     (*(int *)(in_RDI + 0x6c) != *(int *)(in_RDI + 0x70) - *(int *)(in_RDI + 0x68))) {
    local_24 = *(int *)(in_RDI + 0x70) - *(int *)(in_RDI + 0x68);
    error<unsigned_int&,unsigned_int>
              (in_stack_00000018,in_stack_00000010,(uint *)in_stack_00000008,(uint *)unaff_retaddr);
  }
  if (*(int *)(in_RDI + 0x74) == 0) {
    if (*(int *)(in_RDI + 0x70) != 0) {
      error<unsigned_int&>(in_stack_00000028,in_stack_00000020,(uint *)in_stack_00000018);
    }
  }
  else {
    local_20 = align<unsigned_long>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (local_20 != *(uint *)(in_RDI + 0x70)) {
      error<unsigned_int&,unsigned_long&>
                (in_stack_00000018,in_stack_00000010,(uint *)in_stack_00000008,
                 (unsigned_long *)unaff_retaddr);
    }
    local_20 = *(uint *)(in_RDI + 0x74) + local_20;
  }
  if (*(long *)(in_RDI + 0x80) == 0) {
    if (*(long *)(in_RDI + 0x78) != 0) {
      error<unsigned_long&>(in_stack_00000028,in_stack_00000020,(unsigned_long *)in_stack_00000018);
    }
  }
  else {
    local_20 = align<unsigned_long>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (local_20 != *(unsigned_long *)(in_RDI + 0x78)) {
      error<unsigned_long&,unsigned_long&>
                (in_stack_00000018,in_stack_00000010,in_stack_00000008,
                 (unsigned_long *)unaff_retaddr);
    }
    local_20 = *(long *)(in_RDI + 0x80) + local_20;
  }
  bVar1 = isSupercompressionWithGlobalData(local_c);
  if (bVar1) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      toString_abi_cxx11_(in_stack_00000034);
      error<std::__cxx11::string>
                (in_stack_00000028,in_stack_00000020,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_00000018);
      std::__cxx11::string::~string(local_48);
    }
  }
  else {
    bVar1 = isSupercompressionWithNoGlobalData(local_c);
    if ((bVar1) && (*(long *)(in_RDI + 0x80) != 0)) {
      toString_abi_cxx11_(in_stack_00000034);
      error<unsigned_long&,std::__cxx11::string>
                (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateIndices() {
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate dataFormatDescriptor index
    if (header.dataFormatDescriptor.byteOffset == 0 || header.dataFormatDescriptor.byteLength == 0)
        error(HeaderData::IndexDFDMissing, header.dataFormatDescriptor.byteOffset, header.dataFormatDescriptor.byteLength);

    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    std::size_t expectedOffset = KTX2_HEADER_SIZE + levelIndexSize;
    expectedOffset = align(expectedOffset, std::size_t{4});
    if (expectedOffset != header.dataFormatDescriptor.byteOffset)
        error(HeaderData::IndexDFDInvalidOffset, header.dataFormatDescriptor.byteOffset, expectedOffset);
    expectedOffset += header.dataFormatDescriptor.byteLength;

    if (header.dataFormatDescriptor.byteOffset != 0 && header.dataFormatDescriptor.byteLength != 0)
        if (header.keyValueData.byteOffset != 0)
            if (header.dataFormatDescriptor.byteLength != header.keyValueData.byteOffset - header.dataFormatDescriptor.byteOffset)
                error(HeaderData::IndexDFDInvalidLength, header.dataFormatDescriptor.byteLength, header.keyValueData.byteOffset - header.dataFormatDescriptor.byteOffset);

    // Validate keyValueData index
    if (header.keyValueData.byteLength != 0) {
        expectedOffset = align(expectedOffset, std::size_t{4});
        if (expectedOffset != header.keyValueData.byteOffset)
            error(HeaderData::IndexKVDInvalidOffset, header.keyValueData.byteOffset, expectedOffset);
        expectedOffset += header.keyValueData.byteLength;
    } else {
        if (header.keyValueData.byteOffset != 0)
            error(HeaderData::IndexKVDOffsetWithoutLength, header.keyValueData.byteOffset);
    }

    // Validate supercompressionGlobalData index
    if (header.supercompressionGlobalData.byteLength != 0) {
        expectedOffset = align(expectedOffset, std::size_t{8});
        if (expectedOffset != header.supercompressionGlobalData.byteOffset)
            error(HeaderData::IndexSGDInvalidOffset, header.supercompressionGlobalData.byteOffset, expectedOffset);
        expectedOffset += header.supercompressionGlobalData.byteLength;
    } else {
        if (header.supercompressionGlobalData.byteOffset != 0)
            error(HeaderData::IndexSGDOffsetWithoutLength, header.supercompressionGlobalData.byteOffset);
    }

    if (isSupercompressionWithGlobalData(supercompressionScheme)) {
        if (header.supercompressionGlobalData.byteLength == 0)
            error(HeaderData::IndexSGDMissing, toString(supercompressionScheme));
    } else if (isSupercompressionWithNoGlobalData(supercompressionScheme)) {
        if (header.supercompressionGlobalData.byteLength != 0)
            error(HeaderData::IndexSGDNotApplicable, header.supercompressionGlobalData.byteLength, toString(supercompressionScheme));
    }
}